

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty_shellcode.c
# Opt level: O1

int main(void)

{
  char *name [2];
  char *local_18;
  undefined8 local_10;
  
  close(0);
  open("/dev/tty",2);
  local_18 = "/bin/sh";
  local_10 = 0;
  execve("/bin/sh",&local_18,(char **)0x0);
  return 0;
}

Assistant:

int main(void) {
  close(0);
  open("/dev/tty", O_RDWR);
  char * name[2];
  name[0] = "/bin/sh";
  name[1] = NULL;
  execve(name[0], name, NULL);
}